

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getServer
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  if (getp_getServer(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_getServer(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_getServer::desc.min_argc_ = 0;
      getp_getServer::desc.opt_argc_ = 0;
      getp_getServer::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getServer(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getServer::desc);
  if (iVar2 == 0) {
    vVar1 = *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x10);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar1;
    if (vVar1 == 0) {
      retval->typ = VM_NIL;
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getServer(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* return the server object */
    retval->set_obj_or_nil(get_ext()->server);

    /* handled */
    return TRUE;
}